

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

int __thiscall Node::OutputOngo(Node *this,ostream *os,char *OnType,int GoLevel)

{
  int iVar1;
  ostream *poVar2;
  string local_50;
  
  for (; this->Type == 0x1f5; this = this->Tree[1]) {
    OutputOngo(this->Tree[0],os,OnType,GoLevel);
    GoLevel = GoLevel + 1;
  }
  if (this->Type == 0x1d2) {
    Indent_abi_cxx11_(&local_50,this);
    poVar2 = std::operator<<(os,(string *)&local_50);
    poVar2 = std::operator<<(poVar2,"case ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,GoLevel);
    poVar2 = std::operator<<(poVar2,":");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_50);
    Level = Level + 1;
    Indent_abi_cxx11_(&local_50,this);
    poVar2 = std::operator<<(os,(string *)&local_50);
    std::operator<<(poVar2,OnType);
    std::__cxx11::string::~string((string *)&local_50);
    iVar1 = strcmp(OnType,"goto");
    if (iVar1 == 0) {
      poVar2 = std::operator<<(os,' ');
      OutputLabel_abi_cxx11_(&local_50,this);
      poVar2 = std::operator<<(poVar2,(string *)&local_50);
      poVar2 = std::operator<<(poVar2,";");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      poVar2 = std::operator<<(os,'(');
      OutputLabel_abi_cxx11_(&local_50,this);
      poVar2 = std::operator<<(poVar2,(string *)&local_50);
      poVar2 = std::operator<<(poVar2,");");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_50);
      Indent_abi_cxx11_(&local_50,this);
      poVar2 = std::operator<<(os,(string *)&local_50);
      poVar2 = std::operator<<(poVar2,"break;");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::~string((string *)&local_50);
    Level = Level + -1;
  }
  else {
    poVar2 = std::operator<<(os,"Error in computed ");
    poVar2 = std::operator<<(poVar2,OnType);
    poVar2 = std::operator<<(poVar2," (");
    Expression_abi_cxx11_(&local_50,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    poVar2 = std::operator<<(poVar2,") @ ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->lineno);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return 0;
}

Assistant:

int Node::OutputOngo(
	std::ostream& os,	/**< iostream to write C++ code to */
	const char* OnType,	/**< data type */
	int GoLevel		/**< goto level */
)
{
	int flag = 0;

	switch(Type)
	{
	case BAS_N_LIST:
		flag = Tree[0]->OutputOngo(os, OnType, GoLevel);
		flag += Tree[1]->OutputOngo(os, OnType, GoLevel + 1);
		break;

	case BAS_V_USELABEL:
		os << Indent() << "case " << GoLevel << ":" << std::endl;
		Level++;
		os << Indent() << OnType;
		if (strcmp(OnType, "goto") == 0)
		{
			os << ' ' << OutputLabel() << ";" << std::endl;
			// goto doesn't need to be followed by a break
		}
		else
		{
			os << '(' << OutputLabel() << ");" << std::endl;
			os << Indent() << "break;" << std::endl;
		}
		Level--;
		break;

	default:
		os << "Error in computed " << OnType <<
			" (" << Expression() << ") @ " << lineno << std::endl;
		break;
	}
	return flag;
}